

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

map * config_read_string(char *string,size_t size)

{
  parser_token pVar1;
  natwm_error nVar2;
  parser *parser;
  map *map;
  char *local_38;
  char *key;
  
  parser = parser_create(string,size);
  if (parser == (parser *)0x0) {
    map = (map *)0x0;
  }
  else {
    map = map_init();
    if (map == (map *)0x0) {
      map = (map *)0x0;
      internal_logger(natwm_logger,LEVEL_ERROR,"Failed initializing configuration map");
    }
    else {
      map_set_entry_free_function(map,hashmap_free_callback);
      map_set_setting_flag(map,MAP_FLAG_FREE_ENTRY_KEY);
      while (parser->buffer[parser->pos] != '\0') {
        pVar1 = char_to_token(parser->buffer[parser->pos]);
        if (pVar1 == ALPHA_CHAR) {
          local_38 = (char *)0x0;
          key = (char *)0x0;
          nVar2 = parser_read_item(parser,&local_38,(config_value **)&key);
          if (nVar2 == NO_ERROR) {
            nVar2 = map_insert(map,local_38,key);
            if (nVar2 == NO_ERROR) goto LAB_00106257;
            free(local_38);
            config_value_destroy((config_value *)key);
          }
LAB_0010629a:
          internal_logger(natwm_logger,LEVEL_ERROR,"Error reading configuration file!");
          map_destroy(map);
          map = (map *)0x0;
          break;
        }
        if (pVar1 == VARIABLE_START) {
          nVar2 = parser_create_variable(parser);
          if (nVar2 != NO_ERROR) goto LAB_0010629a;
        }
        else if (pVar1 == COMMENT_START) {
          parser_consume_line(parser);
        }
LAB_00106257:
        parser_increment(parser);
      }
    }
    parser_destroy(parser);
  }
  return map;
}

Assistant:

struct map *config_read_string(const char *string, size_t size)
{
        struct parser *parser = parser_create(string, size);

        if (parser == NULL) {
                return NULL;
        }

        struct map *map = config_parse(parser);

        parser_destroy(parser);

        if (map == NULL) {
                return NULL;
        }

        return map;
}